

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

Address * __thiscall cppnet::Address::AsString_abi_cxx11_(Address *this)

{
  int *in_RSI;
  __cxx11 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  __cxx11 local_88 [48];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  Address *this_local;
  
  this_local = this;
  if (*in_RSI == 2) {
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[");
    std::operator+(local_38,(char *)local_58);
    std::__cxx11::to_string(local_88,(uint)*(ushort *)(in_RSI + 10));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   local_38);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_58);
  }
  else {
    std::operator+(local_a8,(char *)(in_RSI + 2));
    std::__cxx11::to_string(local_c8,(uint)*(ushort *)(in_RSI + 10));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   local_a8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a8);
  }
  return this;
}

Assistant:

const std::string Address::AsString() {
    if (_address_type == AT_IPV6) {
        return "[" + _ip + "]:" + std::to_string(_port);

    } else {
        return _ip + ":" + std::to_string(_port);
    }
}